

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.c
# Opt level: O3

int blob_write_json(blob_t *blobs,int count,char *filename)

{
  int iVar1;
  FILE *__s;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  blob_t *pbVar6;
  
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    blob_write_json_cold_1();
    iVar1 = 0;
  }
  else {
    fwrite("{\n  \"blobs\" : [\n",0x10,1,__s);
    if (0 < count) {
      uVar4 = 0;
      do {
        fwrite("    {\n",6,1,__s);
        pbVar6 = blobs + uVar4;
        fprintf(__s,"      \"label\" : %d,\n",(ulong)(uint)(int)pbVar6->label);
        contour_write_json(&blobs[uVar4].external,"external",3,(FILE *)__s);
        fwrite(",\n",2,1,__s);
        if (*(contour_t **)(&blobs[uVar4].external + 1) != (contour_t *)0x0) {
          fwrite("      \"internals\" : [\n",0x16,1,__s);
          if (0 < pbVar6->internal_count) {
            lVar3 = 0;
            lVar5 = 0;
            do {
              contour_write_json((contour_t *)((long)&pbVar6->internal->count + lVar3),(char *)0x0,4
                                 ,(FILE *)__s);
              uVar2 = 0x20;
              if (lVar5 < (long)pbVar6->internal_count + -1) {
                uVar2 = 0x2c;
              }
              fprintf(__s,"%c\n",uVar2);
              lVar5 = lVar5 + 1;
              lVar3 = lVar3 + 0x10;
            } while (lVar5 < pbVar6->internal_count);
          }
          fwrite("      ],\n",9,1,__s);
        }
        fprintf(__s,"      \"euler_number\": %d\n",(ulong)(uint)pbVar6->internal_count);
        uVar2 = 0x20;
        if (uVar4 < count - 1) {
          uVar2 = 0x2c;
        }
        fprintf(__s,"    }%c\n",uVar2);
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)count);
    }
    fwrite("  ]\n}\n",6,1,__s);
    fclose(__s);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int blob_write_json(blob_t *blobs, int count, const char *filename)
{
    int i;
    FILE *out = fopen(filename, "wb");
    if(NULL == out)
    {
        fprintf(stderr, "failed to open %s : %s\n", filename, strerror(errno));
        return 0;
    }
    fprintf(out, "{\n  \"blobs\" : [\n");
    for(i=0; i<count; i++)
    {
        fprintf(out, "    {\n");
        fprintf(out, "      \"label\" : %d,\n", blobs[i].label);    
        contour_write_json(&blobs[i].external, "external", 3, out);
        fprintf(out, ",\n");
        if(NULL != blobs[i].internal)
        {
            int j;
            fprintf(out, "      \"internals\" : [\n");
            for(j=0; j<blobs[i].internal_count; j++)
            {
                contour_write_json(blobs[i].internal+j, NULL, 4, out);
                fprintf(out, "%c\n", (j < (blobs[i].internal_count-1)) ? ',' : ' ');
            }
            fprintf(out, "      ],\n");
        }
        fprintf(out, "      \"euler_number\": %d\n", blobs[i].internal_count);
        fprintf(out, "    }%c\n", (i < (count-1)) ? ',' : ' ');
    }
    fprintf(out, "  ]\n}\n");
    fclose(out);
    return 1;
}